

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_bit_stream.c
# Opt level: O2

void StoreDataWithHuffmanCodes
               (uint8_t *input,size_t start_pos,size_t mask,Command *commands,size_t n_commands,
               uint8_t *lit_depth,uint16_t *lit_bits,uint8_t *cmd_depth,uint16_t *cmd_bits,
               uint8_t *dist_depth,uint16_t *dist_bits,size_t *storage_ix,uint8_t *storage)

{
  byte bVar1;
  ushort uVar2;
  ushort uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  size_t sVar11;
  char *__assertion;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  long lVar16;
  ulong local_60;
  
  sVar11 = 0;
  local_60 = start_pos;
  do {
    if (sVar11 == n_commands) {
      return;
    }
    uVar2 = commands[sVar11].cmd_prefix_;
    bVar1 = cmd_depth[uVar2];
    if (cmd_bits[uVar2] >> (bVar1 & 0x3f) != 0) {
LAB_00117633:
      __assertion = "(bits >> n_bits) == 0";
      uVar4 = 0x36;
      goto LAB_0011764a;
    }
    if (0x38 < bVar1) goto LAB_0011761a;
    uVar4 = commands[sVar11].insert_len_;
    uVar14 = commands[sVar11].copy_len_;
    uVar5 = commands[sVar11].dist_extra_;
    uVar3 = commands[sVar11].dist_prefix_;
    uVar15 = *storage_ix;
    uVar12 = bVar1 + uVar15;
    *(ulong *)(storage + (uVar15 >> 3)) =
         (ulong)cmd_bits[uVar2] << ((byte)uVar15 & 7) | (ulong)storage[uVar15 >> 3];
    *storage_ix = uVar12;
    uVar6 = uVar4;
    if (5 < uVar4) {
      if (uVar4 < 0x82) {
        uVar15 = (ulong)uVar4 - 2;
        uVar6 = 0x1f;
        uVar10 = (uint)uVar15;
        if (uVar10 != 0) {
          for (; uVar10 >> uVar6 == 0; uVar6 = uVar6 - 1) {
          }
        }
        iVar7 = (uVar6 ^ 0xffffffe0) + 0x1f;
        uVar6 = (int)(uVar15 >> ((byte)iVar7 & 0x3f)) + iVar7 * 2 + 2;
      }
      else if (uVar4 < 0x842) {
        uVar6 = 0x1f;
        if (uVar4 - 0x42 != 0) {
          for (; uVar4 - 0x42 >> uVar6 == 0; uVar6 = uVar6 - 1) {
          }
        }
        uVar6 = (uVar6 ^ 0xffffffe0) + 0x2a;
      }
      else {
        uVar6 = 0x15;
        if (0x1841 < uVar4) {
          uVar6 = 0x17 - (uVar4 < 0x5842);
        }
      }
    }
    uVar10 = uVar14 & 0xffffff;
    uVar14 = uVar14 >> 0x18 ^ uVar10;
    if (uVar14 < 10) {
      uVar8 = uVar14 + 0xfffe;
    }
    else if (uVar14 < 0x86) {
      uVar8 = 0x1f;
      uVar13 = (uint)((ulong)uVar14 - 6);
      if (uVar13 != 0) {
        for (; uVar13 >> uVar8 == 0; uVar8 = uVar8 - 1) {
        }
      }
      iVar7 = (uVar8 ^ 0xffffffe0) + 0x1f;
      uVar8 = (int)((ulong)uVar14 - 6 >> ((byte)iVar7 & 0x3f)) + iVar7 * 2 + 4;
    }
    else {
      uVar8 = 0x17;
      if (uVar14 < 0x846) {
        uVar8 = 0x1f;
        if (uVar14 - 0x46 != 0) {
          for (; uVar14 - 0x46 >> uVar8 == 0; uVar8 = uVar8 - 1) {
          }
        }
        uVar8 = (uVar8 ^ 0xffffffe0) + 0x2c;
      }
    }
    uVar15 = (ulong)((uVar6 & 0xffff) << 2);
    iVar7 = *(int *)((long)kInsExtra + uVar15);
    uVar9 = (ulong)((uVar8 & 0xffff) << 2);
    uVar15 = (ulong)(uVar14 - *(int *)((long)kCopyBase + uVar9)) << ((byte)iVar7 & 0x3f) |
             (ulong)(uVar4 - *(int *)((long)kInsBase + uVar15));
    uVar14 = iVar7 + *(int *)((long)kCopyExtra + uVar9);
    if (uVar15 >> ((byte)uVar14 & 0x3f) != 0) goto LAB_00117633;
    if (0x38 < uVar14) {
LAB_0011761a:
      __assertion = "n_bits <= 56";
      uVar4 = 0x37;
LAB_0011764a:
      __assert_fail(__assertion,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/././write_bits.h"
                    ,uVar4,
                    "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)");
    }
    *(ulong *)(storage + (uVar12 >> 3)) = uVar15 << ((byte)uVar12 & 7) | (ulong)storage[uVar12 >> 3]
    ;
    uVar12 = uVar14 + uVar12;
    *storage_ix = uVar12;
    uVar15 = local_60;
    for (lVar16 = 0; -lVar16 != (ulong)uVar4; lVar16 = lVar16 + -1) {
      bVar1 = lit_depth[input[uVar15 & mask]];
      if (lit_bits[input[uVar15 & mask]] >> (bVar1 & 0x3f) != 0) goto LAB_00117633;
      if (0x38 < bVar1) goto LAB_0011761a;
      *(ulong *)(storage + (uVar12 >> 3)) =
           (ulong)lit_bits[input[uVar15 & mask]] << ((byte)uVar12 & 7) | (ulong)storage[uVar12 >> 3]
      ;
      uVar12 = uVar12 + bVar1;
      *storage_ix = uVar12;
      uVar15 = uVar15 + 1;
    }
    if ((uVar10 != 0) && (0x7f < uVar2)) {
      bVar1 = dist_depth[uVar3];
      if (dist_bits[uVar3] >> (bVar1 & 0x3f) != 0) goto LAB_00117633;
      if (bVar1 < 0x39) {
        *(ulong *)(storage + (uVar12 >> 3)) =
             (ulong)dist_bits[uVar3] << ((byte)uVar12 & 7) | (ulong)storage[uVar12 >> 3];
        uVar12 = bVar1 + uVar12;
        *storage_ix = uVar12;
        if ((uVar5 & 0xffffff) >> ((byte)(uVar5 >> 0x18) & 0x3f) != 0) goto LAB_00117633;
        if (uVar5 < 0x39000000) {
          *(ulong *)(storage + (uVar12 >> 3)) =
               (ulong)(uVar5 & 0xffffff) << ((byte)uVar12 & 7) | (ulong)storage[uVar12 >> 3];
          *storage_ix = (uVar5 >> 0x18) + uVar12;
          goto LAB_001175e9;
        }
      }
      goto LAB_0011761a;
    }
LAB_001175e9:
    local_60 = (local_60 + uVar10) - lVar16;
    sVar11 = sVar11 + 1;
  } while( true );
}

Assistant:

static void StoreDataWithHuffmanCodes(const uint8_t* input,
                                      size_t start_pos,
                                      size_t mask,
                                      const Command *commands,
                                      size_t n_commands,
                                      const uint8_t* lit_depth,
                                      const uint16_t* lit_bits,
                                      const uint8_t* cmd_depth,
                                      const uint16_t* cmd_bits,
                                      const uint8_t* dist_depth,
                                      const uint16_t* dist_bits,
                                      size_t* storage_ix,
                                      uint8_t* storage) {
  size_t pos = start_pos;
  size_t i;
  for (i = 0; i < n_commands; ++i) {
    const Command cmd = commands[i];
    const size_t cmd_code = cmd.cmd_prefix_;
    size_t j;
    BrotliWriteBits(
        cmd_depth[cmd_code], cmd_bits[cmd_code], storage_ix, storage);
    StoreCommandExtra(&cmd, storage_ix, storage);
    for (j = cmd.insert_len_; j != 0; --j) {
      const uint8_t literal = input[pos & mask];
      BrotliWriteBits(
          lit_depth[literal], lit_bits[literal], storage_ix, storage);
      ++pos;
    }
    pos += CommandCopyLen(&cmd);
    if (CommandCopyLen(&cmd) && cmd.cmd_prefix_ >= 128) {
      const size_t dist_code = cmd.dist_prefix_;
      const uint32_t distnumextra = cmd.dist_extra_ >> 24;
      const uint32_t distextra = cmd.dist_extra_ & 0xffffff;
      BrotliWriteBits(dist_depth[dist_code], dist_bits[dist_code],
                      storage_ix, storage);
      BrotliWriteBits(distnumextra, distextra, storage_ix, storage);
    }
  }
}